

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::AutoReg::AutoReg
          (AutoReg *this,unique_ptr<Catch::ITestInvoker> *invoker,SourceLineInfo *lineInfo,
          StringRef *classOrMethod,NameAndTags *nameAndTags)

{
  IMutableRegistryHub *pIVar1;
  StringRef *classOrQualifiedMethodName;
  string local_68;
  unique_ptr<Catch::TestCaseInfo> local_48 [3];
  NameAndTags *local_30;
  NameAndTags *nameAndTags_local;
  StringRef *classOrMethod_local;
  SourceLineInfo *lineInfo_local;
  unique_ptr<Catch::ITestInvoker> *invoker_local;
  AutoReg *this_local;
  
  local_30 = nameAndTags;
  nameAndTags_local = (NameAndTags *)classOrMethod;
  classOrMethod_local = (StringRef *)lineInfo;
  lineInfo_local = (SourceLineInfo *)invoker;
  invoker_local = (unique_ptr<Catch::ITestInvoker> *)this;
  pIVar1 = getMutableRegistryHub();
  extractClassName_abi_cxx11_(&local_68,(Catch *)nameAndTags_local,classOrQualifiedMethodName);
  makeTestCaseInfo((Catch *)local_48,&local_68,local_30,(SourceLineInfo *)classOrMethod_local);
  (*pIVar1->_vptr_IMutableRegistryHub[4])(pIVar1,local_48,invoker);
  Detail::unique_ptr<Catch::TestCaseInfo>::~unique_ptr(local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

AutoReg::AutoReg(Detail::unique_ptr<ITestInvoker> invoker, SourceLineInfo const &lineInfo, StringRef const &classOrMethod, NameAndTags const &nameAndTags) noexcept {
        CATCH_TRY{
            getMutableRegistryHub()
                    .registerTest(
                        makeTestCaseInfo(
                            extractClassName(classOrMethod),
                            nameAndTags,
                            lineInfo),
                        std::move(invoker)
                    );
        }